

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_msg.c
# Opt level: O3

void nni_http_free_header(http_header *h)

{
  byte bVar1;
  
  nni_list_node_remove(&h->node);
  bVar1 = h->field_0x20;
  if ((bVar1 & 1) == 0) {
    nni_strfree(h->name);
    h->name = (char *)0x0;
    bVar1 = h->field_0x20;
  }
  if ((bVar1 & 2) == 0) {
    nni_strfree(h->value);
    h->value = (char *)0x0;
    bVar1 = h->field_0x20;
  }
  if ((bVar1 & 4) == 0) {
    return;
  }
  nni_free(h,0x28);
  return;
}

Assistant:

void
nni_http_free_header(http_header *h)
{
	nni_list_node_remove(&h->node);
	if (!h->static_name) {
		nni_strfree(h->name);
		h->name = NULL;
	}
	if (!h->static_value) {
		nni_strfree(h->value);
		h->value = NULL;
	}
	if (h->alloc_header) {
		NNI_FREE_STRUCT(h);
	}
}